

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_plt_qua_zone(REF_GRID ref_grid,REF_INT id,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  double dVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *pFVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double maxdata;
  double mindata;
  double tempdata;
  REF_GLOB *l2c;
  int dataformat;
  int connsharing;
  int varsharing;
  int passive;
  float zonemarker;
  REF_GLOB nnode;
  REF_LONG ncell;
  double local_a8;
  double local_a0;
  FILE *local_98;
  double local_90;
  REF_GLOB *local_88;
  int local_7c;
  ulong local_78;
  double *local_70;
  REF_INT local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  long local_50;
  long local_48;
  ulong local_40;
  REF_CELL local_38;
  
  uVar5 = (ulong)(uint)ldim;
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[6];
  local_54 = 0x43958000;
  local_7c = 2;
  local_58 = 0;
  local_5c = 0;
  local_60 = 0xffffffff;
  local_98 = (FILE *)file;
  uVar3 = ref_grid_compact_cell_id_nodes(ref_grid,ref_cell,id,&local_50,&local_48,&local_88);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xf99,
           "ref_gather_plt_qua_zone",(ulong)uVar3,"l2c");
    return uVar3;
  }
  local_78 = uVar5;
  local_70 = scalar;
  local_64 = id;
  if ((0 < local_50) && (0 < local_48)) {
    local_38 = ref_cell;
    if (ref_mpi->id == 0) {
      sVar4 = fwrite(&local_54,4,1,local_98);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               4000,"ref_gather_plt_qua_zone","zonemarker",1,sVar4);
        return 1;
      }
      if (-3 < (int)local_78) {
        iVar10 = (int)local_78 + 2;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        iVar10 = iVar10 + 1;
        do {
          sVar4 = fwrite(&local_7c,4,1,local_98);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xfa3,"ref_gather_plt_qua_zone","int",1,sVar4);
            return 1;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      pFVar2 = local_98;
      sVar4 = fwrite(&local_58,4,1,local_98);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xfa6,"ref_gather_plt_qua_zone","int",1,sVar4);
        return 1;
      }
      sVar4 = fwrite(&local_5c,4,1,pFVar2);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xfa7,"ref_gather_plt_qua_zone","int",1,sVar4);
        return 1;
      }
      sVar4 = fwrite(&local_60,4,1,pFVar2);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xfa8,"ref_gather_plt_qua_zone","int",1,sVar4);
        return 1;
      }
    }
    lVar11 = 0;
    lVar8 = 0;
    do {
      local_a0 = 1e+200;
      local_a8 = -1e+200;
      if (0 < (long)ref_node->max) {
        dVar14 = -1e+200;
        dVar15 = 1e+200;
        lVar9 = 0;
        lVar6 = lVar11;
        do {
          if ((local_88[lVar9] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar9])) {
            dVar1 = *(double *)((long)ref_node->real + lVar6);
            if (dVar1 <= dVar15) {
              dVar15 = dVar1;
            }
            dVar1 = *(double *)((long)ref_node->real + lVar6);
            local_a8 = dVar14;
            local_a0 = dVar15;
            if (dVar14 <= dVar1) {
              dVar14 = dVar1;
              local_a8 = dVar1;
            }
          }
          lVar9 = lVar9 + 1;
          lVar6 = lVar6 + 0x78;
        } while (ref_node->max != lVar9);
      }
      local_90 = local_a0;
      uVar3 = ref_mpi_min(ref_mpi,&local_90,&local_a0,3);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xfb5,"ref_gather_plt_qua_zone",(ulong)uVar3,"mpi min");
        return uVar3;
      }
      local_90 = local_a8;
      uVar3 = ref_mpi_max(ref_mpi,&local_90,&local_a8,3);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xfb7,"ref_gather_plt_qua_zone",(ulong)uVar3,"mpi max");
        return uVar3;
      }
      if (ref_mpi->id == 0) {
        sVar4 = fwrite(&local_a0,8,1,local_98);
        if (sVar4 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xfb9,"ref_gather_plt_qua_zone","mindata",1,sVar4);
          return 1;
        }
        sVar4 = fwrite(&local_a8,8,1,local_98);
        if (sVar4 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xfba,"ref_gather_plt_qua_zone","maxdata",1,sVar4);
          return 1;
        }
      }
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar8 != 3);
    if (0 < (int)local_78) {
      uVar5 = local_78 & 0xffffffff;
      uVar13 = 0;
      pdVar12 = local_70;
      local_40 = uVar5;
      do {
        local_a0 = 1e+200;
        local_a8 = -1e+200;
        if (0 < (long)ref_node->max) {
          dVar14 = -1e+200;
          dVar15 = 1e+200;
          lVar8 = 0;
          pdVar7 = pdVar12;
          do {
            if ((local_88[lVar8] != -1) && (ref_node->ref_mpi->id == ref_node->part[lVar8])) {
              dVar1 = *pdVar7;
              if (dVar1 <= dVar15) {
                dVar15 = dVar1;
              }
              local_a8 = dVar14;
              local_a0 = dVar15;
              if (dVar14 <= dVar1) {
                dVar14 = dVar1;
                local_a8 = dVar1;
              }
            }
            lVar8 = lVar8 + 1;
            pdVar7 = pdVar7 + uVar5;
          } while (ref_node->max != lVar8);
        }
        local_90 = local_a0;
        uVar3 = ref_mpi_min(ref_mpi,&local_90,&local_a0,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xfc7,"ref_gather_plt_qua_zone",(ulong)uVar3,"mpi min");
          return uVar3;
        }
        local_90 = local_a8;
        uVar3 = ref_mpi_max(ref_mpi,&local_90,&local_a8,3);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xfc9,"ref_gather_plt_qua_zone",(ulong)uVar3,"mpi max");
          return uVar3;
        }
        if (ref_mpi->id == 0) {
          sVar4 = fwrite(&local_a0,8,1,local_98);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xfcb,"ref_gather_plt_qua_zone","mindata",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_a8,8,1,local_98);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xfcc,"ref_gather_plt_qua_zone","maxdata",1,sVar4);
            return 1;
          }
        }
        uVar13 = uVar13 + 1;
        pdVar12 = pdVar12 + 1;
      } while (uVar13 != local_40);
    }
    pFVar2 = local_98;
    uVar3 = ref_gather_node_tec_block
                      (ref_node,local_50,local_88,(REF_INT)local_78,local_70,local_7c,
                       (FILE *)local_98);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xfd2,"ref_gather_plt_qua_zone",(ulong)uVar3,"block points");
      return uVar3;
    }
    uVar3 = ref_gather_cell_id_tec(ref_node,local_38,local_64,local_48,local_88,1,(FILE *)pFVar2);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xfd6,"ref_gather_plt_qua_zone",(ulong)uVar3,"c2n");
      return uVar3;
    }
  }
  if (local_88 != (REF_GLOB *)0x0) {
    free(local_88);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_qua_zone(REF_GRID ref_grid, REF_INT id,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_qua(ref_grid);
  float zonemarker = 299.0;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int dataformat = 2; /*1=Float, 2=Double*/
  int passive = 0;
  int varsharing = 0;
  int connsharing = -1;
  double mindata, maxdata, tempdata;
  REF_INT node, ixyz, i;

  RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, id, &nnode, &ncell,
                                     &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    for (i = 0; i < 3 + ldim; i++) {
      REIS(1, fwrite(&dataformat, sizeof(int), 1, file), "int");
    }

    REIS(1, fwrite(&passive, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varsharing, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&connsharing, sizeof(int), 1, file), "int");
  }

  for (ixyz = 0; ixyz < 3; ixyz++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, ref_node_xyz(ref_node, ixyz, node));
        maxdata = MAX(maxdata, ref_node_xyz(ref_node, ixyz, node));
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }
  for (i = 0; i < ldim; i++) {
    mindata = REF_DBL_MAX;
    maxdata = REF_DBL_MIN;
    for (node = 0; node < ref_node_max(ref_node); node++) {
      if (REF_EMPTY != l2c[node] && ref_node_owned(ref_node, node)) {
        mindata = MIN(mindata, scalar[i + ldim * node]);
        maxdata = MAX(maxdata, scalar[i + ldim * node]);
      }
    }
    tempdata = mindata;
    RSS(ref_mpi_min(ref_mpi, &tempdata, &mindata, REF_DBL_TYPE), "mpi min");
    tempdata = maxdata;
    RSS(ref_mpi_max(ref_mpi, &tempdata, &maxdata, REF_DBL_TYPE), "mpi max");
    if (ref_mpi_once(ref_mpi)) {
      REIS(1, fwrite(&mindata, sizeof(double), 1, file), "mindata");
      REIS(1, fwrite(&maxdata, sizeof(double), 1, file), "maxdata");
    }
  }

  RSS(ref_gather_node_tec_block(ref_node, nnode, l2c, ldim, scalar, dataformat,
                                file),
      "block points");

  RSS(ref_gather_cell_id_tec(ref_node, ref_cell, id, ncell, l2c, REF_TRUE,
                             file),
      "c2n");

  ref_free(l2c);
  return REF_SUCCESS;
}